

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O2

uint64_t yactfr::internal::anon_unknown_0::readFlUIntBe21At3(uint8_t *buf)

{
  return (ulong)((*buf & 0x1f) << 0x10 | (uint)buf[1] << 8) | (ulong)buf[2];
}

Assistant:

std::uint64_t readFlUIntBe21At3(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 8;
    res |= buf[1];
    res <<= 8;
    res |= buf[2];
    res &= UINT64_C(0x1fffff);
    return res;
}